

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

int dotele(void)

{
  bool bVar1;
  char cVar2;
  schar sVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  trap *ptVar7;
  char *pcVar8;
  trap *trap;
  char *line;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  iVar5 = 0x3196e8;
  ptVar7 = t_at(level,(int)u.ux,(int)u.uy);
  if (ptVar7 == (trap *)0x0) {
    trap = (trap *)0x0;
  }
  else {
    trap = (trap *)0x0;
    if ((ptVar7->field_0x8 & 0x3f) == 0x30) {
      trap = ptVar7;
    }
  }
  if (trap == (trap *)0x0) {
LAB_002590cf:
    trap = (trap *)0x0;
  }
  else {
    if ((trap->field_0x8 & 0x40) != 0) {
      pline("This is a vault teleport, usable once only.");
      cVar2 = yn_function("Jump in?","yn",'n');
      if (cVar2 == 'n') {
        trap = (trap *)0x0;
      }
      else {
        deltrap(level,trap);
        newsym((int)u.ux,(int)u.uy);
      }
    }
    if (trap == (trap *)0x0) goto LAB_002590cf;
    pcVar8 = locomotion(youmonst.data,"jump");
    pline("You %s onto the teleportation trap.",pcVar8);
  }
  if (trap != (trap *)0x0) goto LAB_002592b6;
  if ((u.uprops[0xe].extrinsic == 0 && u.uprops[0xe].intrinsic == 0) &&
     (((youmonst.data)->mflags1 & 0x2000000) == 0)) {
LAB_00259149:
    bVar11 = false;
    if ((objects[0x19f].field_0x10 & 1) == 0) {
      bVar1 = false;
      lVar10 = 0;
    }
    else {
      bVar1 = false;
      lVar10 = 0;
      bVar11 = false;
      if (u.uprops[0x1c].intrinsic == 0) {
        lVar10 = 0;
        do {
          bVar11 = spl_book[lVar10].sp_id == 0x19f;
          if (spl_book[lVar10].sp_id == 0x19f) {
            bVar1 = true;
            goto LAB_002591af;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x2b);
        lVar10 = 0x2b;
        bVar1 = false;
      }
    }
LAB_002591af:
    iVar6 = (int)lVar10;
    if ((bVar11) || (flags.debug != '\0')) goto LAB_002591e9;
    if ((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
       (((youmonst.data)->mflags1 & 0x2000000) != 0)) {
      pcVar8 = "You are not able to teleport at will.";
    }
    else {
      pcVar8 = "You don\'t know that spell.";
    }
    iVar5 = 0;
    pline(pcVar8);
LAB_002592ae:
    bVar1 = false;
    goto LAB_002592b1;
  }
  bVar1 = false;
  iVar6 = 0;
  if (u.ulevel < (int)((uint)(urole.malenum != 0x168) * 4 + 8)) {
    bVar1 = false;
    iVar6 = 0;
    if (((youmonst.data)->mflags1 & 0x2000000) == 0) goto LAB_00259149;
  }
LAB_002591e9:
  if (((u.uhunger < 0x65) || (sVar3 = acurr(0), sVar3 < '\x06')) && (flags.debug == '\0')) {
    pcVar8 = "for a teleport spell";
    if (!bVar1) {
      pcVar8 = "to teleport";
    }
    line = "You lack the strength %s.";
LAB_00259224:
    bVar1 = false;
    pline(line,pcVar8);
    iVar5 = 1;
  }
  else {
    iVar9 = (objects[0x19f].oc_oc2 * 7) / 2 + -2;
    if ((u.uen <= iVar9) && (iVar9 = u.uen, flags.debug == '\0')) {
      pcVar8 = "for a teleport spell";
      if (!bVar1) {
        pcVar8 = "to teleport";
      }
      line = "You lack the energy %s.";
      goto LAB_00259224;
    }
    bVar4 = check_capacity("Your concentration falters from carrying so much.");
    if (bVar4 != '\0') {
      iVar5 = 1;
      goto LAB_002592ae;
    }
    if (bVar1) {
      iVar5 = 1;
      exercise(2,'\x01');
      iVar6 = spelleffects(iVar6,'\x01');
      bVar1 = false;
      if (iVar6 == 0) {
        iVar5 = 1;
        if (flags.debug != '\0') goto LAB_00259392;
        iVar5 = 0;
      }
    }
    else {
      u.uen = u.uen - iVar9;
      iflags.botl = '\x01';
LAB_00259392:
      bVar1 = true;
    }
  }
LAB_002592b1:
  if (!bVar1) {
    return iVar5;
  }
LAB_002592b6:
  bVar4 = next_to_u();
  if (bVar4 == '\0') {
    iVar5 = 0;
    pline("You shudder for a moment.");
  }
  else {
    if ((trap == (trap *)0x0) || ((trap->field_0x8 & 0x40) == 0)) {
      iVar5 = tele((char *)0x0);
      if (iVar5 == 0) {
        return 0;
      }
    }
    else {
      vault_tele();
    }
    next_to_u();
    iVar5 = 1;
    if (trap == (trap *)0x0) {
      morehungry(100);
    }
  }
  return iVar5;
}

Assistant:

int dotele(void)
{
	struct trap *trap;

	trap = t_at(level, u.ux, u.uy);
	if (trap && (!trap->tseen || trap->ttyp != TELEP_TRAP))
		trap = 0;

	if (trap) {
		if (trap->once) {
			pline("This is a vault teleport, usable once only.");
			if (yn("Jump in?") == 'n')
				trap = 0;
			else {
				deltrap(level, trap);
				newsym(u.ux, u.uy);
			}
		}
		if (trap)
			pline("You %s onto the teleportation trap.",
			    locomotion(youmonst.data, "jump"));
	}
	if (!trap) {
	    boolean castit = FALSE;
	    int sp_no = 0, energy = 0;

	    if (!Teleportation || (u.ulevel < (Role_if (PM_WIZARD) ? 8 : 12)
					&& !can_teleport(youmonst.data))) {
		/* Try to use teleport away spell. */
		if (objects[SPE_TELEPORT_AWAY].oc_name_known && !Confusion)
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == SPE_TELEPORT_AWAY) {
				castit = TRUE;
				break;
			}
		if (!wizard) {
		    if (!castit) {
			if (!Teleportation)
			    pline("You don't know that spell.");
			else pline("You are not able to teleport at will.");
			return 0;
		    }
		}
	    }

	    if (u.uhunger <= 100 || ACURR(A_STR) < 6) {
		if (!wizard) {
			pline("You lack the strength %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    energy = objects[SPE_TELEPORT_AWAY].oc_level * 7 / 2 - 2;
	    if (u.uen <= energy) {
		if (wizard)
			energy = u.uen;
		else
		{
			pline("You lack the energy %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    if (check_capacity(
			"Your concentration falters from carrying so much."))
		return 1;

	    if (castit) {
		exercise(A_WIS, TRUE);
		if (spelleffects(sp_no, TRUE))
			return 1;
		else
		    if (!wizard)
			return 0;
	    } else {
		u.uen -= energy;
		iflags.botl = 1;
	    }
	}

	if (next_to_u()) {
		if (trap && trap->once) vault_tele();
		else if (!tele(NULL)) return 0;
		next_to_u();
	} else {
		pline("You shudder for a moment.");
		return 0;
	}
	if (!trap) morehungry(100);
	return 1;
}